

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

Statement * __thiscall
rsg::ConditionalStatement::createNextChild(ConditionalStatement *this,GeneratorState *state)

{
  bool bVar1;
  Random *this_00;
  VariableManager *pVVar2;
  Statement *pSVar3;
  VariableType *type;
  bool *pbVar4;
  Expression *pEVar5;
  ConstStridedValueAccess<1> local_f0;
  ConstStridedValueAccess<1> local_e0 [2];
  undefined1 local_c0 [8];
  ValueRange range;
  ExpressionGenerator generator;
  GeneratorState *state_local;
  ConditionalStatement *this_local;
  
  if ((this->m_falseStatement == (Statement *)0x0) && (this->m_trueStatement == (Statement *)0x0)) {
    bVar1 = isElseBlockRequired(this,state);
    if (!bVar1) {
      this_00 = GeneratorState::getRandom(state);
      bVar1 = de::Random::getBool(this_00);
      if (!bVar1) goto LAB_028bc59e;
    }
    pVVar2 = GeneratorState::getVariableManager(state);
    VariableManager::pushValueScope(pVVar2,&this->m_conditionalScope);
    pSVar3 = rsg::anon_unknown_0::createStatement(state);
    this->m_falseStatement = pSVar3;
    this_local = (ConditionalStatement *)this->m_falseStatement;
  }
  else {
LAB_028bc59e:
    if (this->m_trueStatement == (Statement *)0x0) {
      if (this->m_falseStatement != (Statement *)0x0) {
        pVVar2 = GeneratorState::getVariableManager(state);
        VariableManager::popValueScope(pVVar2);
        ValueScope::clear(&this->m_conditionalScope);
      }
      pVVar2 = GeneratorState::getVariableManager(state);
      VariableManager::pushValueScope(pVVar2,&this->m_conditionalScope);
      pSVar3 = rsg::anon_unknown_0::createStatement(state);
      this->m_trueStatement = pSVar3;
      this_local = (ConditionalStatement *)this->m_trueStatement;
    }
    else {
      pVVar2 = GeneratorState::getVariableManager(state);
      VariableManager::popValueScope(pVVar2);
      ValueScope::clear(&this->m_conditionalScope);
      ExpressionGenerator::ExpressionGenerator
                ((ExpressionGenerator *)
                 &range.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,state);
      type = VariableType::getScalarType(TYPE_BOOL);
      ValueRange::ValueRange((ValueRange *)local_c0,type);
      local_e0[0] = (ConstStridedValueAccess<1>)ValueRange::getMin((ValueRange *)local_c0);
      pbVar4 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)local_e0);
      *pbVar4 = false;
      local_f0 = (ConstStridedValueAccess<1>)ValueRange::getMax((ValueRange *)local_c0);
      pbVar4 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)&local_f0);
      *pbVar4 = true;
      pEVar5 = ExpressionGenerator::generate
                         ((ExpressionGenerator *)
                          &range.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(ValueRange *)local_c0
                          ,1);
      this->m_condition = pEVar5;
      this_local = (ConditionalStatement *)0x0;
      ValueRange::~ValueRange((ValueRange *)local_c0);
      ExpressionGenerator::~ExpressionGenerator
                ((ExpressionGenerator *)
                 &range.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  return &this_local->super_Statement;
}

Assistant:

Statement* ConditionalStatement::createNextChild (GeneratorState& state)
{
	// If has neither true or false statements, choose randomly whether to create false block.
	if (!m_falseStatement && !m_trueStatement && (isElseBlockRequired(state) || state.getRandom().getBool()))
	{
		// Construct false statement
		state.getVariableManager().pushValueScope(m_conditionalScope);
		m_falseStatement = createStatement(state);

		return m_falseStatement;
	}
	else if (!m_trueStatement)
	{
		if (m_falseStatement)
		{
			// Pop previous value scope.
			state.getVariableManager().popValueScope();
			m_conditionalScope.clear();
		}

		// Construct true statement
		state.getVariableManager().pushValueScope(m_conditionalScope);
		m_trueStatement = createStatement(state);

		return m_trueStatement;
	}
	else
	{
		// Pop conditional scope.
		state.getVariableManager().popValueScope();
		m_conditionalScope.clear();

		// Create condition
		DE_ASSERT(!m_condition);

		ExpressionGenerator generator(state);

		ValueRange range = ValueRange(VariableType::getScalarType(VariableType::TYPE_BOOL));
		range.getMin().asBool() = false;
		range.getMax().asBool() = true;

		m_condition = generator.generate(range, 1);

		return DE_NULL; // Done with this statement
	}
}